

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_property.c
# Opt level: O0

int connectionEncoding(mpt_connection *con,mpt_convertable *src)

{
  char local_49;
  int local_48;
  uint uStack_44;
  uint8_t rtype;
  int res;
  int32_t val;
  char *where;
  mpt_stream *srm;
  mpt_data_decoder_t dec;
  mpt_data_encoder_t enc;
  mpt_convertable *src_local;
  mpt_connection *con_local;
  
  where = (char *)0x0;
  if ((con->out).sock._id < 0) {
    where = (char *)(con->out).buf._buf;
  }
  enc = (mpt_data_encoder_t)src;
  src_local = (mpt_convertable *)con;
  if (src == (mpt_convertable *)0x0) {
    if (where == (char *)0x0) {
      return 0;
    }
    local_49 = '\x02';
    local_48 = 0;
  }
  else {
    local_48 = (*src->_vptr->convert)(src,0x73,&res);
    if (local_48 < 0) {
      local_48 = (*(code *)**(undefined8 **)enc)(enc,0x79,&local_49);
      if (local_48 < 0) {
        local_48 = (*(code *)**(undefined8 **)enc)(enc,0x69,&stack0xffffffffffffffbc);
        if (((local_48 < 0) || ((int)uStack_44 < 0)) || (0xff < (int)uStack_44)) {
          return -2;
        }
        local_49 = (char)uStack_44;
      }
    }
    else {
      uStack_44 = mpt_encoding_value(_res,0xffffffff);
      if (((int)uStack_44 < 0) || (0xff < (int)uStack_44)) {
        return -2;
      }
      local_49 = (char)uStack_44;
    }
  }
  if (where == (char *)0x0) {
    if (local_49 == '\0') {
      con_local._4_4_ = 0;
    }
    else {
      con_local._4_4_ = -2;
    }
  }
  else if (((local_49 == '\0') ||
           (dec = (mpt_data_decoder_t)mpt_message_encoder(local_49), dec == (mpt_data_decoder_t)0x0)
           ) || (srm = (mpt_stream *)mpt_message_decoder(local_49), srm == (mpt_stream *)0x0)) {
    con_local._4_4_ = -2;
  }
  else if (*(long *)(where + 0x28) == 0) {
    uStack_44 = mpt_stream_flags((mpt_streaminfo *)where);
    if ((uStack_44 & 4) == 0) {
      if (*(long *)(where + 0x50) != 0) {
        (**(code **)(where + 0x50))(where + 0x28,0);
      }
      if (*(long *)(where + 0x90) != 0) {
        (**(code **)(where + 0x90))(where + 0x78,0);
      }
      *(mpt_data_decoder_t *)(where + 0x90) = dec;
      *(mpt_stream **)(where + 0x50) = srm;
      con_local._4_4_ = local_48;
    }
    else {
      con_local._4_4_ = -0x21;
    }
  }
  else {
    con_local._4_4_ = -0x20;
  }
  return con_local._4_4_;
}

Assistant:

static int connectionEncoding(MPT_STRUCT(connection) *con, MPT_INTERFACE(convertable) *src)
{
	MPT_TYPE(data_encoder) enc;
	MPT_TYPE(data_decoder) dec;
	MPT_STRUCT(stream) *srm = 0;
	char *where;
	int32_t val;
	int res;
	uint8_t rtype;
	
	if (!MPT_socket_active(&con->out.sock)) {
		srm = (void *) con->out.buf._buf;
	}
	/* (re)set default encoding */
	if (!src) {
		if (!srm) {
			return 0;
		}
		rtype = MPT_ENUM(EncodingCobs);
		res = 0;
	}
	/* resolve type description */
	else if ((res = src->_vptr->convert(src, 's', &where)) >= 0) {
		val = mpt_encoding_value(where, -1);
		if (val < 0 || val > UINT8_MAX) {
			return MPT_ERROR(BadValue);
		}
		rtype = val;
	}
	/* explicit encoding code */
	else if ((res = src->_vptr->convert(src, 'y', &rtype)) < 0) {
		res = src->_vptr->convert(src, 'i', &val);
		if (res < 0 || val < 0 || val > UINT8_MAX) {
			return MPT_ERROR(BadValue);
		}
		rtype = val;
	}
	/* no encoding on datagrams */
	if (!srm) {
		if (rtype) {
			return MPT_ERROR(BadValue);
		}
		return 0;
	}
	/* active stream needs valid coding */
	if (!rtype
	    || !(enc = mpt_message_encoder(rtype))
	    || !(dec = mpt_message_decoder(rtype))) {
		return MPT_ERROR(BadValue);
	}
	/* check if state is consistent */
	if (srm->_rd._state._ctx) {
		return MPT_MESGERR(ActiveInput);
	}
	val = mpt_stream_flags(&srm->_info);
	if (val & MPT_STREAMFLAG(MesgActive)) {
		return MPT_MESGERR(InProgress);
	}
	/* clear existing coding state contexts */
	if (srm->_rd._dec) {
		srm->_rd._dec(&srm->_rd._state, 0, 0);
	}
	if (srm->_wd._enc) {
		srm->_wd._enc(&srm->_wd._state, 0, 0);
	}
	srm->_wd._enc = enc;
	srm->_rd._dec = dec;
	
	return res;
}